

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

void __thiscall
duckdb::BaseReservoirSampling::Serialize(BaseReservoirSampling *this,Serializer *serializer)

{
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,100,"next_index_to_sample",&this->next_index_to_sample);
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"min_weight_threshold");
  (*serializer->_vptr_Serializer[0x1a])(this->min_weight_threshold,serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x66,"min_weighted_entry_index",&this->min_weighted_entry_index);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x67,"num_entries_to_skip_b4_next_sample",
             &this->num_entries_to_skip_b4_next_sample);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x68,"num_entries_seen_total",&this->num_entries_seen_total);
  Serializer::
  WritePropertyWithDefault<std::priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>>
            (serializer,0x69,"reservoir_weights",&this->reservoir_weights);
  return;
}

Assistant:

void BaseReservoirSampling::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<idx_t>(100, "next_index_to_sample", next_index_to_sample);
	serializer.WriteProperty<double>(101, "min_weight_threshold", min_weight_threshold);
	serializer.WritePropertyWithDefault<idx_t>(102, "min_weighted_entry_index", min_weighted_entry_index);
	serializer.WritePropertyWithDefault<idx_t>(103, "num_entries_to_skip_b4_next_sample", num_entries_to_skip_b4_next_sample);
	serializer.WritePropertyWithDefault<idx_t>(104, "num_entries_seen_total", num_entries_seen_total);
	serializer.WritePropertyWithDefault<std::priority_queue<std::pair<double, idx_t>>>(105, "reservoir_weights", reservoir_weights);
}